

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::RegisterObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,IPalObject *pobjToRegister,
          CAllowedObjectTypes *paot,DWORD dwRightsRequested,HANDLE *pHandle,
          IPalObject **ppobjRegistered)

{
  int iVar1;
  DWORD DVar2;
  BOOL BVar3;
  PLIST_ENTRY p_Var4;
  PLIST_ENTRY p_Var5;
  SHMPTR SVar6;
  _LIST_ENTRY *p_Var7;
  LPVOID pvVar8;
  VOID *pvSharedImmutableData;
  SHMObjData *psmod;
  VOID *pvImmutableData;
  PLIST_ENTRY _EX_ListHead_1;
  PLIST_ENTRY _EX_Blink_1;
  SHMObjData *psmodListHead;
  PLIST_ENTRY _EX_ListHead;
  PLIST_ENTRY _EX_Blink;
  SHMPTR shmObjectListHead;
  BOOL fShared;
  BOOL fInherit;
  IPalObject *pobjExisting;
  CObjectType *potObj;
  CObjectAttributes *poa;
  SHMObjData *psmodNew;
  CSharedMemoryObject *pshmobj;
  HANDLE *ppVStack_38;
  PAL_ERROR palError;
  HANDLE *pHandle_local;
  CAllowedObjectTypes *pCStack_28;
  DWORD dwRightsRequested_local;
  CAllowedObjectTypes *paot_local;
  IPalObject *pobjToRegister_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  pshmobj._4_4_ = 0;
  poa = (CObjectAttributes *)0x0;
  shmObjectListHead._4_4_ = 0;
  shmObjectListHead._0_4_ = 0;
  psmodNew = (SHMObjData *)pobjToRegister;
  ppVStack_38 = pHandle;
  pHandle_local._4_4_ = dwRightsRequested;
  pCStack_28 = paot;
  paot_local = (CAllowedObjectTypes *)pobjToRegister;
  pobjToRegister_local = (IPalObject *)pthr;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xee);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (paot_local == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xef);
    fprintf(_stderr,"Expression: NULL != pobjToRegister\n");
  }
  if (pCStack_28 == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf0);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (ppVStack_38 == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf1);
    fprintf(_stderr,"Expression: NULL != pHandle\n");
  }
  if (ppobjRegistered == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf2);
    fprintf(_stderr,"Expression: NULL != ppobjRegistered\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  potObj = (CObjectType *)(**(code **)(*(long *)paot_local->m_rgfAllowedTypes + 8))();
  if (potObj == (CObjectType *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x101);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (potObj->m_pInitRoutine != (OBJECTINITROUTINE)0x0) {
    shmObjectListHead._4_4_ = *(int *)(potObj->m_pInitRoutine + 0x10);
  }
  pobjExisting = (IPalObject *)(*(code *)**(undefined8 **)paot_local->m_rgfAllowedTypes)();
  iVar1 = (**(code **)(psmodNew->shmPrevObj + 0x48))();
  shmObjectListHead._0_4_ = (uint)(iVar1 == 1);
  InternalEnterCriticalSection((CPalThread *)pobjToRegister_local,&this->m_csListLock);
  if ((uint)shmObjectListHead != 0) {
    SHMLock();
  }
  DVar2 = CPalString::GetStringLength((CPalString *)potObj);
  if (DVar2 == 0) {
    _EX_ListHead_1 = (this->m_leAnonymousObjects).Blink;
    pvImmutableData = &this->m_leAnonymousObjects;
    p_Var4 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    p_Var5 = _EX_ListHead_1;
    p_Var4->Flink = &this->m_leAnonymousObjects;
    p_Var4 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    p_Var4->Blink = p_Var5;
    p_Var5 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    _EX_ListHead_1->Flink = p_Var5;
    p_Var5 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    *(PLIST_ENTRY *)((long)pvImmutableData + 8) = p_Var5;
  }
  else {
    _EX_Blink = (PLIST_ENTRY)0x0;
    if ((uint)shmObjectListHead == 0) {
      fprintf(_stderr,"] %s %s:%d","RegisterObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x11f);
      fprintf(_stderr,"Expression: fShared\n");
    }
    pshmobj._4_4_ =
         (*(this->super_IPalObjectManager)._vptr_IPalObjectManager[2])
                   (this,pobjToRegister_local,potObj,pCStack_28,&fShared);
    if (pshmobj._4_4_ == 0) {
      pshmobj._4_4_ =
           (*(this->super_IPalObjectManager)._vptr_IPalObjectManager[3])
                     (this,pobjToRegister_local,_fShared,(ulong)pHandle_local._4_4_,
                      (ulong)(shmObjectListHead._4_4_ != 0),0,ppVStack_38);
      if (pshmobj._4_4_ == 0) {
        *ppobjRegistered = _fShared;
        pshmobj._4_4_ = 0xb7;
      }
      else {
        (*_fShared->_vptr_IPalObject[8])(_fShared,pobjToRegister_local);
      }
      goto LAB_003b43e5;
    }
    if (pshmobj._4_4_ != 0x7b) goto LAB_003b43e5;
    _EX_ListHead = (this->m_leNamedObjects).Blink;
    psmodListHead = (SHMObjData *)&this->m_leNamedObjects;
    p_Var4 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    p_Var5 = _EX_ListHead;
    p_Var4->Flink = &this->m_leNamedObjects;
    p_Var4 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    p_Var4->Blink = p_Var5;
    p_Var5 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    _EX_ListHead->Flink = p_Var5;
    p_Var5 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)psmodNew);
    psmodListHead->shmNextObj = (SHMPTR)p_Var5;
    SVar6 = CSharedMemoryObject::GetShmObjData((CSharedMemoryObject *)psmodNew);
    poa = (CObjectAttributes *)SHMPtrToPtr(SVar6);
    if (poa == (CObjectAttributes *)0x0) {
      fprintf(_stderr,"] %s %s:%d","RegisterObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x15e);
      fprintf(_stderr,"Failure to map shared object data\n");
      pshmobj._4_4_ = 0x54f;
      goto LAB_003b43e5;
    }
    _EX_Blink = (PLIST_ENTRY)SHMGetInfo(SIID_NAMED_OBJECTS);
    if (_EX_Blink != (PLIST_ENTRY)0x0) {
      _EX_Blink_1 = (PLIST_ENTRY)SHMPtrToPtr((SHMPTR)_EX_Blink);
      if (_EX_Blink_1 == (PLIST_ENTRY)0x0) {
        fprintf(_stderr,"] %s %s:%d","RegisterObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x170);
        fprintf(_stderr,"Failure to map shared object data\n");
        pshmobj._4_4_ = 0x54f;
        goto LAB_003b43e5;
      }
      *(PLIST_ENTRY *)&(poa->sObjectName).m_dwStringLength = _EX_Blink;
      p_Var7 = (_LIST_ENTRY *)CSharedMemoryObject::GetShmObjData((CSharedMemoryObject *)psmodNew);
      _EX_Blink_1->Flink = p_Var7;
    }
    *(undefined4 *)&poa->pSecurityAttributes = 1;
    SVar6 = CSharedMemoryObject::GetShmObjData((CSharedMemoryObject *)psmodNew);
    BVar3 = SHMSetInfo(SIID_NAMED_OBJECTS,SVar6);
    if (BVar3 == 0) {
      fprintf(_stderr,"] %s %s:%d","RegisterObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x17a);
      fprintf(_stderr,"Failed to set shared named object list head\n");
      pshmobj._4_4_ = 0x54f;
      goto LAB_003b43e5;
    }
  }
  if (((uint)shmObjectListHead != 0) &&
     (DVar2 = CObjectType::GetImmutableDataSize((CObjectType *)pobjExisting), DVar2 != 0)) {
    pshmobj._4_4_ = (**(code **)(*(long *)paot_local->m_rgfAllowedTypes + 0x10))(paot_local,&psmod);
    if (pshmobj._4_4_ != 0) {
      fprintf(_stderr,"] %s %s:%d","RegisterObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x195);
      fprintf(_stderr,"Failure to obtain object immutable data\n");
      goto LAB_003b43e5;
    }
    SVar6 = CSharedMemoryObject::GetShmObjData((CSharedMemoryObject *)psmodNew);
    pvVar8 = SHMPtrToPtr(SVar6);
    if (pvVar8 == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","RegisterObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x1b0);
      fprintf(_stderr,"Failure to map pshmobj->GetShmObjData()\n");
      pshmobj._4_4_ = 0x54f;
      goto LAB_003b43e5;
    }
    pvVar8 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar8 + 0x20));
    if (pvVar8 == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","RegisterObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x1a9);
      fprintf(_stderr,"Failure to map psmod->shmObjImmutableData\n");
      pshmobj._4_4_ = 0x54f;
      goto LAB_003b43e5;
    }
    DVar2 = CObjectType::GetImmutableDataSize((CObjectType *)pobjExisting);
    memcpy(pvVar8,psmod,(ulong)DVar2);
  }
  pshmobj._4_4_ =
       (*(this->super_IPalObjectManager)._vptr_IPalObjectManager[3])
                 (this,pobjToRegister_local,paot_local,(ulong)pHandle_local._4_4_,
                  (ulong)(shmObjectListHead._4_4_ != 0),0,ppVStack_38);
  if (pshmobj._4_4_ == 0) {
    *ppobjRegistered = (IPalObject *)paot_local;
    paot_local = (CAllowedObjectTypes *)0x0;
  }
LAB_003b43e5:
  if ((uint)shmObjectListHead != 0) {
    SHMRelease();
  }
  InternalLeaveCriticalSection((CPalThread *)pobjToRegister_local,&this->m_csListLock);
  if (paot_local != (CAllowedObjectTypes *)0x0) {
    (**(code **)(*(long *)paot_local->m_rgfAllowedTypes + 0x40))(paot_local,pobjToRegister_local);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pshmobj._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::RegisterObject(
    CPalThread *pthr,
    IPalObject *pobjToRegister,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequested,
    HANDLE *pHandle,                 // OUT
    IPalObject **ppobjRegistered     // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    CSharedMemoryObject *pshmobj = static_cast<CSharedMemoryObject*>(pobjToRegister);
    SHMObjData *psmodNew = NULL;
    CObjectAttributes *poa;
    CObjectType *potObj;
    IPalObject *pobjExisting;
    BOOL fInherit = FALSE;
    BOOL fShared = FALSE;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pobjToRegister);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != pHandle);
    _ASSERTE(NULL != ppobjRegistered);

    ENTRY("CSharedMemoryObjectManager::RegisterObject "
        "(this=%p, pthr=%p, pobjToRegister=%p, paot=%p, "
        "dwRightsRequested=%d, pHandle=%p, ppobjRegistered=%p)\n",
        this,
        pthr,
        pobjToRegister,
        paot,
        dwRightsRequested,
        pHandle,
        ppobjRegistered
        );

    poa = pobjToRegister->GetObjectAttributes();
    _ASSERTE(NULL != poa);

    if (NULL != poa->pSecurityAttributes)
    {
        fInherit = poa->pSecurityAttributes->bInheritHandle;
    }

    potObj = pobjToRegister->GetObjectType();
    fShared = (SharedObject == pshmobj->GetObjectDomain());
    
    InternalEnterCriticalSection(pthr, &m_csListLock);

    if (fShared)
    {
        //
        // We only need to acquire the shared memory lock if this
        // object is actually shared.
        //
        
        SHMLock();
    }

    if (0 != poa->sObjectName.GetStringLength())
    {
        SHMPTR shmObjectListHead = SHMNULL;

        //
        // The object must be shared
        //

        _ASSERTE(fShared);
        
        //
        // Check if an object by this name already exists
        //

        palError = LocateObject(
            pthr,
            &poa->sObjectName,
            paot,
            &pobjExisting
            );

        if (NO_ERROR == palError)
        {
            //
            // Obtain a new handle to the existing object
            //

            palError = ObtainHandleForObject(
                pthr,
                pobjExisting,
                dwRightsRequested,
                fInherit,
                NULL, 
                pHandle
                );

            if (NO_ERROR == palError)
            {
                //
                // Transfer object reference to out param
                //

                *ppobjRegistered = pobjExisting;
                palError = ERROR_ALREADY_EXISTS;
            }
            else
            {
                pobjExisting->ReleaseReference(pthr);
            }

            goto RegisterObjectExit;
        }
        else if (ERROR_INVALID_NAME != palError)
        {
            //
            // Something different than an object not found error
            // occurred. This is most likely due to a type conflict.
            //

            goto RegisterObjectExit;
        }

        //
        // Insert the object on the named object lists
        //

        InsertTailList(&m_leNamedObjects, pshmobj->GetObjectListLink());

        psmodNew = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
        if (NULL == psmodNew)
        {
            ASSERT("Failure to map shared object data\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }

        shmObjectListHead = SHMGetInfo(SIID_NAMED_OBJECTS);
        if (SHMNULL != shmObjectListHead)
        {
            SHMObjData *psmodListHead;
            
            psmodListHead = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjectListHead);
            if (NULL != psmodListHead)
            {
                psmodNew->shmNextObj = shmObjectListHead;
                psmodListHead->shmPrevObj = pshmobj->GetShmObjData();
            }
            else
            {
                ASSERT("Failure to map shared object data\n");
                palError = ERROR_INTERNAL_ERROR;
                goto RegisterObjectExit;
            }
        }

        psmodNew->fAddedToList = TRUE;

        if (!SHMSetInfo(SIID_NAMED_OBJECTS, pshmobj->GetShmObjData()))
        {
            ASSERT("Failed to set shared named object list head\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }
    }
    else
    {
        //
        // Place the object on the anonymous object list
        //

        InsertTailList(&m_leAnonymousObjects, pshmobj->GetObjectListLink());
    }

    //
    // Hoist the object's immutable data (if any) into shared memory if
    // the object is shared
    //

    if (fShared && 0 != potObj->GetImmutableDataSize())
    {
        VOID *pvImmutableData;
        SHMObjData *psmod;

        palError = pobjToRegister->GetImmutableData(&pvImmutableData);
        if (NO_ERROR != palError)
        {
            ASSERT("Failure to obtain object immutable data\n");
            goto RegisterObjectExit;
        }

        psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
        if (NULL != psmod)
        {
            VOID *pvSharedImmutableData =
                SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjImmutableData);
            
            if (NULL != pvSharedImmutableData)
            {
                CopyMemory(
                    pvSharedImmutableData,
                    pvImmutableData,
                    potObj->GetImmutableDataSize()
                    );
            }
            else
            {
                ASSERT("Failure to map psmod->shmObjImmutableData\n");
                palError = ERROR_INTERNAL_ERROR;
                goto RegisterObjectExit;
            }
        }
        else
        {
            ASSERT("Failure to map pshmobj->GetShmObjData()\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }
    }

    //
    // Obtain a handle for the new object
    //

    palError = ObtainHandleForObject(
        pthr,
        pobjToRegister,
        dwRightsRequested,
        fInherit,
        NULL, 
        pHandle
        );

    if (NO_ERROR == palError)
    {
        //
        // Transfer pobjToRegister reference to out param
        //

        *ppobjRegistered = pobjToRegister;
        pobjToRegister = NULL;
    }
        
RegisterObjectExit:

    if (fShared)
    {
        SHMRelease();
    }
    
    InternalLeaveCriticalSection(pthr, &m_csListLock);

    if (NULL != pobjToRegister)
    {
        pobjToRegister->ReleaseReference(pthr);
    }

    LOGEXIT("CSharedMemoryObjectManager::RegisterObject return %d\n", palError);

    return palError;
}